

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pogg-http.c
# Opt level: O2

int pogg_mainloop(http_server_t *server,char *filename,int quiet)

{
  __time_t _Var1;
  __suseconds_t _Var2;
  int iVar3;
  uint uVar4;
  unsigned_long uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  unsigned_long uVar9;
  ulong uVar10;
  timeval tv;
  ogg_page_t page;
  vorbis_stream_t vorbis;
  
  vorbis_stream_init(&vorbis);
  iVar3 = file_open_read(&vorbis.file,filename);
  if ((iVar3 == 0) || (iVar3 = vorbis_stream_read_hdrs(&vorbis), iVar3 == 0)) {
    iVar3 = 0;
    fprintf(_stderr,"Could not open ogg file: %s\n",filename);
    vorbis_stream_destroy(&vorbis);
  }
  else {
    if (quiet == 0) {
      fprintf(_stderr,"\rStreaming %s...\n",filename);
    }
    ogg_page_init(&page);
    uVar9 = 0;
    while ((iVar3 = ogg_next_page(&vorbis.file,&page), -1 < iVar3 && ((finished & 1) == 0))) {
      gettimeofday((timeval *)&tv,(__timezone_ptr_t)0x0);
      _Var2 = tv.tv_usec;
      _Var1 = tv.tv_sec;
      iVar3 = http_server_main(server,&vorbis);
      if (iVar3 == 0) {
        fwrite("Http main error\n",0x10,1,_stderr);
        file_close(&vorbis.file);
        vorbis_stream_destroy(&vorbis);
        ogg_page_destroy(&page);
        return 0;
      }
      lVar8 = 0;
      for (uVar10 = 0; uVar10 < server->num_clients; uVar10 = uVar10 + 1) {
        iVar3 = *(int *)(server->clients->buf + lVar8 + -0x10);
        if (((iVar3 != -1) && (1 < *(int *)(server->clients->buf + lVar8 + -0xc))) &&
           (iVar3 = unix_write(iVar3,page.raw.data,page.size), page.size != (long)iVar3)) {
          fprintf(_stderr,"Error writing to client %d\n",uVar10 & 0xffffffff);
          http_client_close(server,(http_client_t *)(server->clients->buf + lVar8 + -0x10));
        }
        lVar8 = lVar8 + 0x2018;
      }
      uVar5 = ogg_position_to_msecs(&page,vorbis.audio_sample_rate);
      pogg_mainloop::wait_time = (uVar5 - uVar9) + pogg_mainloop::wait_time;
      if (200 < pogg_mainloop::wait_time) {
        usleep((int)pogg_mainloop::wait_time * 1000);
      }
      if (quiet == 0) {
        iVar3 = pogg_mainloop::count + 1;
        iVar7 = pogg_mainloop::count % 10;
        pogg_mainloop::count = iVar3;
        if (iVar7 == 0) {
          uVar10 = (uVar5 / 1000) % 0x3c;
          if (vorbis.file.size == 0) {
            fprintf(_stderr,"\r%02ld:%02ld %ld %3ldkbit/s %4ldb ",uVar5 / 60000,uVar10,
                    vorbis.file.offset,vorbis.bitrate_nominal / 1000,page.size);
          }
          else {
            lVar8 = (long)(((float)uVar5 / ((float)vorbis.file.offset + 1.0)) *
                          (float)vorbis.file.size);
            fprintf(_stderr,"\r%02ld:%02ld/%02ld:%02ld %7ld/%7ld (%3ld%%) %3ldkbit/s %4ldb ",
                    uVar5 / 60000,uVar10,lVar8 / 60000,(lVar8 / 1000) % 0x3c,vorbis.file.offset,
                    vorbis.file.size,
                    (long)(((float)vorbis.file.offset * 100.0) / (float)vorbis.file.size),
                    vorbis.bitrate_nominal / 1000,page.size);
          }
        }
        fflush(_stderr);
      }
      gettimeofday((timeval *)&tv,(__timezone_ptr_t)0x0);
      pogg_mainloop::wait_time =
           ((tv.tv_sec - _Var1) * -1000 + pogg_mainloop::wait_time) -
           (ulong)(tv.tv_usec - _Var2) / 1000;
      uVar6 = (uint)pogg_mainloop::wait_time;
      uVar4 = -uVar6;
      if (0 < (int)uVar6) {
        uVar4 = uVar6;
      }
      uVar9 = uVar5;
      if (1000 < uVar4) {
        pogg_mainloop::wait_time = 0;
      }
    }
    iVar3 = file_close(&vorbis.file);
    if (iVar3 == 0) {
      iVar3 = 0;
      fprintf(_stderr,"Could not close ogg file %s\n",filename);
      vorbis_stream_destroy(&vorbis);
      ogg_page_destroy(&page);
    }
    else {
      vorbis_stream_destroy(&vorbis);
      ogg_page_destroy(&page);
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int pogg_mainloop(http_server_t *server, char *filename, int quiet) {
  /*M
    Open file for reading.
  **/
  vorbis_stream_t vorbis;
  vorbis_stream_init(&vorbis);

  if (!file_open_read(&vorbis.file, filename) ||
      !vorbis_stream_read_hdrs(&vorbis)) {
    fprintf(stderr, "Could not open ogg file: %s\n", filename);
    vorbis_stream_destroy(&vorbis);
    return 0;
  }

  if (!quiet)
    fprintf(stderr, "\rStreaming %s...\n", filename);

  static long wait_time = 0;
  unsigned long page_time = 0, last_time = 0;

  ogg_page_t page;
  ogg_page_init(&page);

  /*M
    Cycle through the frames and send them using HTTP.
  **/
  while ((ogg_next_page(&vorbis.file, &page) >= 0) && !finished) {
    /*M
      Get start time for this page iteration.
    **/
    struct timeval tv;
    gettimeofday(&tv, NULL);
    unsigned long start_sec, start_usec;
    start_sec = tv.tv_sec;
    start_usec = tv.tv_usec;

    /*M
      Go through HTTP main routine and check for timeouts,
      received data, etc...
    **/
    if (!http_server_main(server, &vorbis)) {
      fprintf(stderr, "Http main error\n");
      file_close(&vorbis.file);
      vorbis_stream_destroy(&vorbis);
      ogg_page_destroy(&page);
      return 0;
    }

    /*M
      Write frame to HTTP clients.
    **/
    int i;
    for (i = 0; i < server->num_clients; i++) {
      if ((server->clients[i].fd != -1) &&
          (server->clients[i].found >= 2)) {
        int ret;

        ret = unix_write(server->clients[i].fd, page.raw.data, page.size);

        if (ret != page.size) {
          fprintf(stderr, "Error writing to client %d\n", i);
          http_client_close(server, server->clients + i);
        }
      }
    }
    last_time = page_time;
    page_time = ogg_position_to_msecs(&page, vorbis.audio_sample_rate);
    wait_time += page_time - last_time;

    /*M
      Sleep for duration of frame.
    **/
    if (wait_time > 200)
      usleep((wait_time) * 1000);

    /*M
      Print information.
    **/
    if (!quiet) {
      static int count = 0;
      if ((count++ % 10) == 0) {
        if (vorbis.file.size > 0) {
          fprintf(stderr,
                  "\r%02ld:%02ld/%02ld:%02ld %7ld/%7ld "
                  "(%3ld%%) %3ldkbit/s %4ldb ",
                  (page_time / 1000) / 60,
                  (page_time / 1000) % 60,
                  (long) ((float) (page_time) /
                          ((float) vorbis.file.offset + 1) *
                          (float) vorbis.file.size) /
                  60000,
                  (long) ((float) (page_time) /
                          ((float) vorbis.file.offset + 1) *
                          (float) vorbis.file.size) /
                  1000 % 60,
                  vorbis.file.offset,
                  vorbis.file.size,
                  (long) (100 * (float) vorbis.file.offset / (float) vorbis.file.size),
                  vorbis.bitrate_nominal / 1000,
                  page.size);
        } else {
          fprintf(stderr, "\r%02ld:%02ld %ld %3ldkbit/s %4ldb ",
                  (page_time / 1000) / 60,
                  (page_time / 1000) % 60,
                  vorbis.file.offset,
                  vorbis.bitrate_nominal / 1000,
                  page.size);
        }
      }
      fflush(stderr);
    }

    /*M
      Get length of iteration.
    **/
    gettimeofday(&tv, NULL);
    unsigned long len =
        (tv.tv_sec - start_sec) * 1000 + (tv.tv_usec - start_usec) / 1000;

    wait_time -= len;
    if (abs((int)wait_time) > MAX_WAIT_TIME)
      wait_time = 0;
  }

  if (!file_close(&vorbis.file)) {
    fprintf(stderr, "Could not close ogg file %s\n", filename);
    vorbis_stream_destroy(&vorbis);
    ogg_page_destroy(&page);
    return 0;
  }

  vorbis_stream_destroy(&vorbis);
  ogg_page_destroy(&page);

  return 1;
}